

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O2

void kratos::TransformIfCase::transform_block(StmtBlock *stmts)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar1;
  Stmt *stmt;
  bool bVar2;
  int iVar3;
  uint64_t index;
  long lVar4;
  undefined1 local_90 [8];
  shared_ptr<kratos::SwitchStmt> switch_stmt;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> local_70 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  uint64_t local_60;
  _Alloc_hider local_58;
  Var *target;
  Stmt *pSStack_48;
  vector<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
  if_stmts;
  
  local_60 = (long)(stmts->stmts_).
                   super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(stmts->stmts_).
                   super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4;
  this = &switch_stmt.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ;
  target = (Var *)stmts;
  for (index = 0; local_60 != index; index = index + 1) {
    StmtBlock::get_stmt((StmtBlock *)&stack0xffffffffffffffb8,(uint64_t)target);
    stmt = pSStack_48;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&if_stmts);
    local_58._M_p = (pointer)0x0;
    pSStack_48 = (Stmt *)0x0;
    if_stmts.
    super__Vector_base<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    if_stmts.
    super__Vector_base<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    bVar2 = has_target_if(stmt,(Var **)&local_58,
                          (vector<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
                           *)&stack0xffffffffffffffb8);
    if (bVar2 && (long *)local_58._M_p != (long *)0x0) {
      lVar4 = (long)if_stmts.
                    super__Vector_base<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
                    ._M_impl.super__Vector_impl_data._M_start - (long)pSStack_48;
      iVar3 = (**(code **)(*(long *)local_58._M_p + 0x38))();
      if (iVar3 != 0) {
        if (((ulong)(uint)(1 << ((byte)iVar3 & 0x1f)) <= (ulong)(lVar4 >> 4)) ||
           (peVar1 = ((if_stmts.
                       super__Vector_base<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[-1].
                       super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     else_body_).
                     super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
           (peVar1->super_StmtBlock).stmts_.
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           *(pointer *)
            ((long)&(peVar1->super_StmtBlock).stmts_.
                    super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
            + 8))) {
          Stmt::as<kratos::IfStmt>((Stmt *)this);
          change_if_to_switch((TransformIfCase *)local_90,(shared_ptr<kratos::IfStmt> *)this,
                              (vector<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
                               *)&stack0xffffffffffffffb8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
          std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<kratos::SwitchStmt,void>
                    (local_70,(__shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2> *)
                              local_90);
          StmtBlock::set_child((StmtBlock *)target,index,(shared_ptr<kratos::Stmt> *)local_70);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&switch_stmt);
        }
      }
    }
    std::vector<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
    ::~vector((vector<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
               *)&stack0xffffffffffffffb8);
  }
  return;
}

Assistant:

void static transform_block(StmtBlock* stmts) {
        auto const stmt_count = stmts->size();
        for (uint64_t i = 0; i < stmt_count; i++) {
            auto* stmt = stmts->get_stmt(i).get();
            Var* target = nullptr;
            std::vector<std::shared_ptr<IfStmt>> if_stmts;
            if (has_target_if(stmt, target, if_stmts) && target) {
                uint64_t cases = if_stmts.size();
                uint64_t expected_case = 1u << target->width();
                bool has_else = !(if_stmts.back()->else_body()->empty());
                if (expected_case > 1 && (cases >= expected_case || has_else)) {
                    auto switch_stmt = change_if_to_switch(stmt->as<IfStmt>(), if_stmts);
                    stmts->set_child(i, switch_stmt);
                }
            }
        }
    }